

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

PropResult __thiscall
Clasp::ClauseHead::propagate(ClauseHead *this,Solver *s,Literal p,uint32 *param_3)

{
  uint uVar1;
  pointer puVar2;
  int iVar3;
  uint uVar4;
  size_t extraout_RDX;
  ushort uVar5;
  Solver *__ptr;
  ushort uVar6;
  uint uVar7;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *this_00;
  bool bVar8;
  Antecedent local_38;
  size_t __size;
  
  uVar4 = p.rep_ & 0xfffffffe ^ 2;
  __size = (size_t)uVar4;
  uVar7 = this->head_[1].rep_ ^ uVar4;
  bVar8 = uVar7 < 2;
  uVar1 = this->head_[!bVar8].rep_;
  puVar2 = (s->assign_).assign_.ebo_.buf;
  uVar6 = 0x100;
  uVar5 = 1;
  if ((byte)(*(byte *)((long)puVar2 + (ulong)(uVar1 & 0xfffffffc)) & 3) !=
      (byte)(2U - ((uVar1 & 2) == 0))) {
    uVar1 = this->head_[2].rep_;
    __ptr = (Solver *)
            (CONCAT71((int7)((ulong)puVar2 >> 8),
                      *(undefined1 *)((long)puVar2 + (ulong)(uVar1 & 0xfffffffc))) &
            0xffffffffffffff03);
    if ((char)__ptr == (char)(((uVar1 & 2) == 0) + '\x01')) {
      __ptr = s;
      iVar3 = (*(this->super_Constraint)._vptr_Constraint[0x17])(this,s,(ulong)bVar8);
      if ((char)iVar3 == '\0') {
        local_38.data_ = (uint64)this;
        bVar8 = Solver::force(s,this->head_ + (bVar8 ^ 1),&local_38);
        uVar5 = (ushort)bVar8;
        goto LAB_0016acc0;
      }
      this_00 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                ((s->watches_).ebo_.buf + ((ulong)(this->head_[uVar7 < 2].rep_ >> 1) ^ 1));
      __size = extraout_RDX;
    }
    else {
      this->head_[uVar7 < 2].rep_ = uVar1;
      this->head_[2].rep_ = uVar4;
      this_00 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                ((s->watches_).ebo_.buf + ((ulong)(uVar1 >> 1) ^ 1));
    }
    if ((ulong)this_00->right_ < (ulong)this_00->left_ + 8) {
      bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::realloc
                (this_00,__ptr,__size);
    }
    uVar1 = this_00->left_;
    *(ClauseHead **)(this_00->buf_ + uVar1) = this;
    this_00->left_ = uVar1 + 8;
    uVar6 = 0;
  }
LAB_0016acc0:
  return (PropResult)(uVar6 | uVar5);
}

Assistant:

Constraint::PropResult ClauseHead::propagate(Solver& s, Literal p, uint32&) {
	Literal* head = head_;
	uint32 wLit   = (head[1] == ~p); // pos of false watched literal
	if (s.isTrue(head[1-wLit])) {
		return Constraint::PropResult(true, true);
	}
	else if (!s.isFalse(head[2])) {
		assert(!isSentinel(head[2]) && "Invalid ClauseHead!");
		head[wLit] = head[2];
		head[2]    = ~p;
		s.addWatch(~head[wLit], ClauseWatch(this));
		return Constraint::PropResult(true, false);
	}
	else if (updateWatch(s, wLit)) {
		assert(!s.isFalse(head_[wLit]));
		s.addWatch(~head[wLit], ClauseWatch(this));
		return Constraint::PropResult(true, false);
	}
	return PropResult(s.force(head_[1^wLit], this), true);
}